

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginViewportSideBar
               (char *name,ImGuiViewport *viewport_p,ImGuiDir dir,float axis_size,
               ImGuiWindowFlags window_flags)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  ImGuiWindow *pIVar4;
  long lVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ImVec2 pos;
  ImRect avail_rect;
  ImVec2 size;
  ImVec2 local_60;
  undefined1 local_58 [8];
  ulong uStack_50;
  char *local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar4 = FindWindowByName(name);
  if ((pIVar4 == (ImGuiWindow *)0x0) || (pIVar4->BeginCount == 0)) {
    if (viewport_p == (ImGuiViewport *)0x0) {
      viewport_p = GetMainViewport();
    }
    auVar9._8_8_ = 0;
    auVar9._0_4_ = (viewport_p->Size).x;
    auVar9._4_4_ = (viewport_p->Size).y;
    uVar1 = *(ulong *)&viewport_p[4].Size.y;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar1;
    uVar2 = *(undefined8 *)&viewport_p[4].WorkPos.y;
    auVar7._0_4_ = (viewport_p->Pos).x + (float)uVar1;
    auVar7._4_4_ = (viewport_p->Pos).y + (float)(uVar1 >> 0x20);
    auVar7._8_8_ = 0;
    auVar9 = vsubps_avx(auVar9,auVar13);
    auVar10._0_4_ = auVar9._0_4_ + (float)uVar2;
    auVar10._4_4_ = auVar9._4_4_ + (float)((ulong)uVar2 >> 0x20);
    auVar10._8_4_ = auVar9._8_4_ + 0.0;
    auVar10._12_4_ = auVar9._12_4_ + 0.0;
    uVar1 = vcmpps_avx512vl(auVar10,ZEXT816(0) << 0x20,6);
    auVar11._0_4_ = auVar7._0_4_ + (float)((uint)((byte)uVar1 & 1) * (int)auVar10._0_4_);
    auVar11._4_4_ = auVar7._4_4_ + (float)((uint)((byte)(uVar1 >> 1) & 1) * (int)auVar10._4_4_);
    auVar11._8_4_ = (float)((uint)((byte)(uVar1 >> 2) & 1) * (int)auVar10._8_4_) + 0.0;
    auVar11._12_4_ = (float)((uint)((byte)(uVar1 >> 3) & 1) * (int)auVar10._12_4_) + 0.0;
    _local_58 = vmovlhps_avx(auVar7,auVar11);
    local_60 = (ImVec2)vmovlps_avx(auVar7);
    if ((dir | 2U) == 3) {
      lVar5 = (ulong)((dir & 0xfffffffeU) == 2) * 4;
      *(float *)(local_58 + lVar5 + -8) = *(float *)(local_58 + lVar5 + 8) - axis_size;
    }
    bVar6 = (dir & 0xfffffffeU) == 2;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_58;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uStack_50;
    auVar9 = vsubps_avx(auVar12,auVar8);
    local_40 = (ImVec2)vmovlps_avx(auVar9);
    (&local_40.x)[bVar6] = axis_size;
    local_38.x = 0.0;
    local_38.y = 0.0;
    local_48 = name;
    SetNextWindowPos(&local_60,0,&local_38);
    SetNextWindowSize(&local_40,0);
    name = local_48;
    if ((dir & 0xfffffffdU) == 0) {
      (&viewport_p[4].Size.y)[bVar6] = axis_size + (&viewport_p[4].Size.y)[bVar6];
    }
    else if ((dir | 2U) == 3) {
      (&viewport_p[4].WorkPos.y)[bVar6] = (&viewport_p[4].WorkPos.y)[bVar6] - axis_size;
    }
  }
  PushStyleVar(3,0.0);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uStack_50;
  _local_58 = auVar3 << 0x40;
  PushStyleVar(5,(ImVec2 *)local_58);
  bVar6 = Begin(name,(bool *)0x0,window_flags | 7);
  PopStyleVar(2);
  return bVar6;
}

Assistant:

bool ImGui::BeginViewportSideBar(const char* name, ImGuiViewport* viewport_p, ImGuiDir dir, float axis_size, ImGuiWindowFlags window_flags)
{
    IM_ASSERT(dir != ImGuiDir_None);

    ImGuiWindow* bar_window = FindWindowByName(name);
    if (bar_window == NULL || bar_window->BeginCount == 0)
    {
        // Calculate and set window size/position
        ImGuiViewportP* viewport = (ImGuiViewportP*)(void*)(viewport_p ? viewport_p : GetMainViewport());
        ImRect avail_rect = viewport->GetBuildWorkRect();
        ImGuiAxis axis = (dir == ImGuiDir_Up || dir == ImGuiDir_Down) ? ImGuiAxis_Y : ImGuiAxis_X;
        ImVec2 pos = avail_rect.Min;
        if (dir == ImGuiDir_Right || dir == ImGuiDir_Down)
            pos[axis] = avail_rect.Max[axis] - axis_size;
        ImVec2 size = avail_rect.GetSize();
        size[axis] = axis_size;
        SetNextWindowPos(pos);
        SetNextWindowSize(size);

        // Report our size into work area (for next frame) using actual window size
        if (dir == ImGuiDir_Up || dir == ImGuiDir_Left)
            viewport->BuildWorkOffsetMin[axis] += axis_size;
        else if (dir == ImGuiDir_Down || dir == ImGuiDir_Right)
            viewport->BuildWorkOffsetMax[axis] -= axis_size;
    }

    window_flags |= ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove;
    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowMinSize, ImVec2(0, 0)); // Lift normal size constraint
    bool is_open = Begin(name, NULL, window_flags);
    PopStyleVar(2);

    return is_open;
}